

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int iVar63;
  ulong uVar64;
  long lVar65;
  uint uVar66;
  long lVar67;
  ulong uVar68;
  ulong uVar69;
  ulong *puVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  bool bVar74;
  bool bVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  float fVar107;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar128 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_cf0;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar70 = local_7f8;
  local_800 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar119 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar122 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar128 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar36 = fVar3 * 0.99999964;
  fVar37 = fVar4 * 0.99999964;
  fVar38 = fVar5 * 0.99999964;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar63 = (tray->tnear).field_0.i[k];
  auVar100 = ZEXT1664(CONCAT412(iVar63,CONCAT48(iVar63,CONCAT44(iVar63,iVar63))));
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  iVar63 = (tray->tfar).field_0.i[k];
  auVar106 = ZEXT1664(CONCAT412(iVar63,CONCAT48(iVar63,CONCAT44(iVar63,iVar63))));
  iVar63 = 1 << ((uint)k & 0x1f);
  auVar77._4_4_ = iVar63;
  auVar77._0_4_ = iVar63;
  auVar77._8_4_ = iVar63;
  auVar77._12_4_ = iVar63;
  auVar77._16_4_ = iVar63;
  auVar77._20_4_ = iVar63;
  auVar77._24_4_ = iVar63;
  auVar77._28_4_ = iVar63;
  auVar78 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar77 = vpand_avx2(auVar77,auVar78);
  local_c20 = vpcmpeqd_avx2(auVar77,auVar78);
  bVar75 = true;
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar84._16_4_ = 0x3f800000;
  auVar84._20_4_ = 0x3f800000;
  auVar84._24_4_ = 0x3f800000;
  auVar84._28_4_ = 0x3f800000;
  auVar78._8_4_ = 0xbf800000;
  auVar78._0_8_ = 0xbf800000bf800000;
  auVar78._12_4_ = 0xbf800000;
  auVar78._16_4_ = 0xbf800000;
  auVar78._20_4_ = 0xbf800000;
  auVar78._24_4_ = 0xbf800000;
  auVar78._28_4_ = 0xbf800000;
  auVar77 = vblendvps_avx(auVar84,auVar78,local_b40);
  auVar116 = ZEXT3264(auVar77);
  do {
    uVar72 = puVar70[-1];
    puVar70 = puVar70 + -1;
    auVar94 = auVar100._0_16_;
    auVar101 = auVar106._0_16_;
    auVar117 = auVar119._0_16_;
    auVar120 = auVar122._0_16_;
    auVar124 = auVar128._0_16_;
    while ((uVar72 & 8) == 0) {
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + uVar71),auVar117);
      auVar76._0_4_ = fVar36 * auVar39._0_4_;
      auVar76._4_4_ = fVar36 * auVar39._4_4_;
      auVar76._8_4_ = fVar36 * auVar39._8_4_;
      auVar76._12_4_ = fVar36 * auVar39._12_4_;
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + uVar73),auVar120);
      auVar81._0_4_ = fVar37 * auVar39._0_4_;
      auVar81._4_4_ = fVar37 * auVar39._4_4_;
      auVar81._8_4_ = fVar37 * auVar39._8_4_;
      auVar81._12_4_ = fVar37 * auVar39._12_4_;
      auVar39 = vmaxps_avx(auVar76,auVar81);
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + uVar69),auVar124);
      auVar82._0_4_ = fVar38 * auVar76._0_4_;
      auVar82._4_4_ = fVar38 * auVar76._4_4_;
      auVar82._8_4_ = fVar38 * auVar76._8_4_;
      auVar82._12_4_ = fVar38 * auVar76._12_4_;
      auVar76 = vmaxps_avx(auVar82,auVar94);
      auVar39 = vmaxps_avx(auVar39,auVar76);
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + (uVar71 ^ 0x10)),auVar117);
      auVar83._0_4_ = fVar3 * auVar76._0_4_;
      auVar83._4_4_ = fVar3 * auVar76._4_4_;
      auVar83._8_4_ = fVar3 * auVar76._8_4_;
      auVar83._12_4_ = fVar3 * auVar76._12_4_;
      auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + (uVar73 ^ 0x10)),auVar120);
      auVar89._0_4_ = fVar4 * auVar76._0_4_;
      auVar89._4_4_ = fVar4 * auVar76._4_4_;
      auVar89._8_4_ = fVar4 * auVar76._8_4_;
      auVar89._12_4_ = fVar4 * auVar76._12_4_;
      auVar76 = vminps_avx(auVar83,auVar89);
      auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + (uVar69 ^ 0x10)),auVar124);
      auVar90._0_4_ = fVar5 * auVar81._0_4_;
      auVar90._4_4_ = fVar5 * auVar81._4_4_;
      auVar90._8_4_ = fVar5 * auVar81._8_4_;
      auVar90._12_4_ = fVar5 * auVar81._12_4_;
      auVar81 = vminps_avx(auVar90,auVar101);
      auVar76 = vminps_avx(auVar76,auVar81);
      auVar39 = vcmpps_avx(auVar39,auVar76,2);
      uVar66 = vmovmskps_avx(auVar39);
      if (uVar66 == 0) goto LAB_00583b9c;
      uVar64 = uVar72 & 0xfffffffffffffff0;
      lVar67 = 0;
      for (uVar72 = (ulong)(byte)uVar66; (uVar72 & 1) == 0;
          uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar67 = lVar67 + 1;
      }
      uVar72 = *(ulong *)(uVar64 + lVar67 * 8);
      uVar66 = (uVar66 & 0xff) - 1 & uVar66 & 0xff;
      uVar68 = (ulong)uVar66;
      if (uVar66 != 0) {
        *puVar70 = uVar72;
        lVar67 = 0;
        for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
          lVar67 = lVar67 + 1;
        }
        uVar66 = uVar66 - 1 & uVar66;
        uVar68 = (ulong)uVar66;
        bVar74 = uVar66 == 0;
        while( true ) {
          puVar70 = puVar70 + 1;
          uVar72 = *(ulong *)(uVar64 + lVar67 * 8);
          if (bVar74) break;
          *puVar70 = uVar72;
          lVar67 = 0;
          for (uVar72 = uVar68; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
            lVar67 = lVar67 + 1;
          }
          uVar68 = uVar68 - 1 & uVar68;
          bVar74 = uVar68 == 0;
        }
      }
    }
    uVar64 = (ulong)((uint)uVar72 & 0xf);
    if (uVar64 != 8) {
      uVar72 = uVar72 & 0xfffffffffffffff0;
      lVar67 = 0;
      local_cc0 = auVar116._0_32_;
      do {
        lVar65 = lVar67 * 0x60;
        pSVar6 = context->scene;
        ppfVar7 = (pSVar6->vertices).items;
        pfVar8 = ppfVar7[*(uint *)(uVar72 + 0x40 + lVar65)];
        auVar91._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x20 + lVar65));
        auVar91._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + lVar65));
        pfVar9 = ppfVar7[*(uint *)(uVar72 + 0x48 + lVar65)];
        auVar95._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar72 + 0x28 + lVar65));
        auVar95._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar72 + 8 + lVar65));
        pfVar10 = ppfVar7[*(uint *)(uVar72 + 0x44 + lVar65)];
        auVar108._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar72 + 0x24 + lVar65));
        auVar108._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar72 + 4 + lVar65));
        pfVar11 = ppfVar7[*(uint *)(uVar72 + 0x4c + lVar65)];
        auVar125._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar72 + 0x2c + lVar65));
        auVar125._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar72 + 0xc + lVar65));
        lVar1 = uVar72 + 0x40 + lVar65;
        local_b00 = *(undefined8 *)(lVar1 + 0x10);
        uStack_af8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_af0 = local_b00;
        uStack_ae8 = uStack_af8;
        lVar1 = uVar72 + 0x50 + lVar65;
        local_b20 = *(undefined8 *)(lVar1 + 0x10);
        uStack_b18 = *(undefined8 *)(lVar1 + 0x18);
        auVar81 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x10 + lVar65)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar72 + 0x18 + lVar65)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x10 + lVar65)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar72 + 0x18 + lVar65)));
        auVar82 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar72 + 0x14 + lVar65)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar72 + 0x1c + lVar65)))
        ;
        auVar76 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar72 + 0x14 + lVar65)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar72 + 0x1c + lVar65)))
        ;
        auVar83 = vunpcklps_avx(auVar39,auVar76);
        auVar89 = vunpcklps_avx(auVar81,auVar82);
        auVar39 = vunpckhps_avx(auVar81,auVar82);
        auVar82 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x30 + lVar65)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar72 + 0x38 + lVar65)));
        auVar76 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x30 + lVar65)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar72 + 0x38 + lVar65)));
        auVar90 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar72 + 0x34 + lVar65)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar72 + 0x3c + lVar65)))
        ;
        auVar81 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar72 + 0x34 + lVar65)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar72 + 0x3c + lVar65)))
        ;
        auVar81 = vunpcklps_avx(auVar76,auVar81);
        auVar43 = vunpcklps_avx(auVar82,auVar90);
        auVar76 = vunpckhps_avx(auVar82,auVar90);
        uStack_b10 = local_b20;
        uStack_b08 = uStack_b18;
        auVar77 = vunpcklps_avx(auVar108,auVar125);
        auVar78 = vunpcklps_avx(auVar91,auVar95);
        auVar121 = vunpcklps_avx(auVar78,auVar77);
        auVar77 = vunpckhps_avx(auVar78,auVar77);
        auVar78 = vunpckhps_avx(auVar108,auVar125);
        auVar84 = vunpckhps_avx(auVar91,auVar95);
        auVar78 = vunpcklps_avx(auVar84,auVar78);
        auVar96._16_16_ = auVar89;
        auVar96._0_16_ = auVar89;
        auVar109._16_16_ = auVar39;
        auVar109._0_16_ = auVar39;
        auVar85._16_16_ = auVar83;
        auVar85._0_16_ = auVar83;
        auVar141._16_16_ = auVar43;
        auVar141._0_16_ = auVar43;
        auVar102._16_16_ = auVar76;
        auVar102._0_16_ = auVar76;
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar126._4_4_ = uVar2;
        auVar126._0_4_ = uVar2;
        auVar126._8_4_ = uVar2;
        auVar126._12_4_ = uVar2;
        auVar126._16_4_ = uVar2;
        auVar126._20_4_ = uVar2;
        auVar126._24_4_ = uVar2;
        auVar126._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar137._4_4_ = uVar2;
        auVar137._0_4_ = uVar2;
        auVar137._8_4_ = uVar2;
        auVar137._12_4_ = uVar2;
        auVar137._16_4_ = uVar2;
        auVar137._20_4_ = uVar2;
        auVar137._24_4_ = uVar2;
        auVar137._28_4_ = uVar2;
        auVar79._16_16_ = auVar81;
        auVar79._0_16_ = auVar81;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar139._4_4_ = uVar2;
        auVar139._0_4_ = uVar2;
        auVar139._8_4_ = uVar2;
        auVar139._12_4_ = uVar2;
        auVar139._16_4_ = uVar2;
        auVar139._20_4_ = uVar2;
        auVar139._24_4_ = uVar2;
        auVar139._28_4_ = uVar2;
        local_c80 = vsubps_avx(auVar121,auVar126);
        auVar121 = vsubps_avx(auVar77,auVar137);
        local_ca0 = vsubps_avx(auVar78,auVar139);
        auVar77 = vsubps_avx(auVar96,auVar126);
        auVar78 = vsubps_avx(auVar109,auVar137);
        auVar84 = vsubps_avx(auVar85,auVar139);
        auVar85 = vsubps_avx(auVar141,auVar126);
        auVar91 = vsubps_avx(auVar102,auVar137);
        auVar40 = vsubps_avx(auVar79,auVar139);
        auVar79 = vsubps_avx(auVar85,local_c80);
        auVar95 = vsubps_avx(auVar91,auVar121);
        auVar96 = vsubps_avx(auVar40,local_ca0);
        auVar80._0_4_ = local_c80._0_4_ + auVar85._0_4_;
        auVar80._4_4_ = local_c80._4_4_ + auVar85._4_4_;
        auVar80._8_4_ = local_c80._8_4_ + auVar85._8_4_;
        auVar80._12_4_ = local_c80._12_4_ + auVar85._12_4_;
        auVar80._16_4_ = local_c80._16_4_ + auVar85._16_4_;
        auVar80._20_4_ = local_c80._20_4_ + auVar85._20_4_;
        auVar80._24_4_ = local_c80._24_4_ + auVar85._24_4_;
        auVar80._28_4_ = local_c80._28_4_ + auVar85._28_4_;
        auVar92._0_4_ = auVar121._0_4_ + auVar91._0_4_;
        auVar92._4_4_ = auVar121._4_4_ + auVar91._4_4_;
        auVar92._8_4_ = auVar121._8_4_ + auVar91._8_4_;
        auVar92._12_4_ = auVar121._12_4_ + auVar91._12_4_;
        auVar92._16_4_ = auVar121._16_4_ + auVar91._16_4_;
        auVar92._20_4_ = auVar121._20_4_ + auVar91._20_4_;
        auVar92._24_4_ = auVar121._24_4_ + auVar91._24_4_;
        auVar92._28_4_ = auVar121._28_4_ + auVar91._28_4_;
        fVar14 = local_ca0._0_4_;
        auVar103._0_4_ = auVar40._0_4_ + fVar14;
        fVar15 = local_ca0._4_4_;
        auVar103._4_4_ = auVar40._4_4_ + fVar15;
        fVar16 = local_ca0._8_4_;
        auVar103._8_4_ = auVar40._8_4_ + fVar16;
        fVar17 = local_ca0._12_4_;
        auVar103._12_4_ = auVar40._12_4_ + fVar17;
        fVar18 = local_ca0._16_4_;
        auVar103._16_4_ = auVar40._16_4_ + fVar18;
        fVar19 = local_ca0._20_4_;
        auVar103._20_4_ = auVar40._20_4_ + fVar19;
        fVar20 = local_ca0._24_4_;
        auVar103._24_4_ = auVar40._24_4_ + fVar20;
        fVar107 = local_ca0._28_4_;
        auVar103._28_4_ = auVar40._28_4_ + fVar107;
        auVar41._4_4_ = auVar96._4_4_ * auVar92._4_4_;
        auVar41._0_4_ = auVar96._0_4_ * auVar92._0_4_;
        auVar41._8_4_ = auVar96._8_4_ * auVar92._8_4_;
        auVar41._12_4_ = auVar96._12_4_ * auVar92._12_4_;
        auVar41._16_4_ = auVar96._16_4_ * auVar92._16_4_;
        auVar41._20_4_ = auVar96._20_4_ * auVar92._20_4_;
        auVar41._24_4_ = auVar96._24_4_ * auVar92._24_4_;
        auVar41._28_4_ = uVar2;
        auVar76 = vfmsub231ps_fma(auVar41,auVar95,auVar103);
        auVar42._4_4_ = auVar79._4_4_ * auVar103._4_4_;
        auVar42._0_4_ = auVar79._0_4_ * auVar103._0_4_;
        auVar42._8_4_ = auVar79._8_4_ * auVar103._8_4_;
        auVar42._12_4_ = auVar79._12_4_ * auVar103._12_4_;
        auVar42._16_4_ = auVar79._16_4_ * auVar103._16_4_;
        auVar42._20_4_ = auVar79._20_4_ * auVar103._20_4_;
        auVar42._24_4_ = auVar79._24_4_ * auVar103._24_4_;
        auVar42._28_4_ = auVar103._28_4_;
        auVar39 = vfmsub231ps_fma(auVar42,auVar96,auVar80);
        auVar46._4_4_ = auVar95._4_4_ * auVar80._4_4_;
        auVar46._0_4_ = auVar95._0_4_ * auVar80._0_4_;
        auVar46._8_4_ = auVar95._8_4_ * auVar80._8_4_;
        auVar46._12_4_ = auVar95._12_4_ * auVar80._12_4_;
        auVar46._16_4_ = auVar95._16_4_ * auVar80._16_4_;
        auVar46._20_4_ = auVar95._20_4_ * auVar80._20_4_;
        auVar46._24_4_ = auVar95._24_4_ * auVar80._24_4_;
        auVar46._28_4_ = auVar80._28_4_;
        auVar81 = vfmsub231ps_fma(auVar46,auVar79,auVar92);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar138._4_4_ = uVar2;
        auVar138._0_4_ = uVar2;
        auVar138._8_4_ = uVar2;
        auVar138._12_4_ = uVar2;
        auVar138._16_4_ = uVar2;
        auVar138._20_4_ = uVar2;
        auVar138._24_4_ = uVar2;
        auVar138._28_4_ = uVar2;
        local_b80 = *(float *)(ray + k * 4 + 0xc0);
        auVar47._4_4_ = local_b80 * auVar81._4_4_;
        auVar47._0_4_ = local_b80 * auVar81._0_4_;
        auVar47._8_4_ = local_b80 * auVar81._8_4_;
        auVar47._12_4_ = local_b80 * auVar81._12_4_;
        auVar47._16_4_ = local_b80 * 0.0;
        auVar47._20_4_ = local_b80 * 0.0;
        auVar47._24_4_ = local_b80 * 0.0;
        auVar47._28_4_ = auVar92._28_4_;
        auVar39 = vfmadd231ps_fma(auVar47,auVar138,ZEXT1632(auVar39));
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_b60._4_4_ = uVar2;
        local_b60._0_4_ = uVar2;
        local_b60._8_4_ = uVar2;
        local_b60._12_4_ = uVar2;
        local_b60._16_4_ = uVar2;
        local_b60._20_4_ = uVar2;
        local_b60._24_4_ = uVar2;
        local_b60._28_4_ = uVar2;
        auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),local_b60,ZEXT1632(auVar76));
        local_ba0 = vsubps_avx(auVar121,auVar78);
        local_bc0 = vsubps_avx(local_ca0,auVar84);
        auVar140._0_4_ = auVar121._0_4_ + auVar78._0_4_;
        auVar140._4_4_ = auVar121._4_4_ + auVar78._4_4_;
        auVar140._8_4_ = auVar121._8_4_ + auVar78._8_4_;
        auVar140._12_4_ = auVar121._12_4_ + auVar78._12_4_;
        auVar140._16_4_ = auVar121._16_4_ + auVar78._16_4_;
        auVar140._20_4_ = auVar121._20_4_ + auVar78._20_4_;
        auVar140._24_4_ = auVar121._24_4_ + auVar78._24_4_;
        auVar140._28_4_ = auVar121._28_4_ + auVar78._28_4_;
        auVar104._0_4_ = fVar14 + auVar84._0_4_;
        auVar104._4_4_ = fVar15 + auVar84._4_4_;
        auVar104._8_4_ = fVar16 + auVar84._8_4_;
        auVar104._12_4_ = fVar17 + auVar84._12_4_;
        auVar104._16_4_ = fVar18 + auVar84._16_4_;
        auVar104._20_4_ = fVar19 + auVar84._20_4_;
        auVar104._24_4_ = fVar20 + auVar84._24_4_;
        fVar123 = auVar84._28_4_;
        auVar104._28_4_ = fVar107 + fVar123;
        fVar111 = local_bc0._0_4_;
        fVar113 = local_bc0._4_4_;
        auVar48._4_4_ = auVar140._4_4_ * fVar113;
        auVar48._0_4_ = auVar140._0_4_ * fVar111;
        fVar21 = local_bc0._8_4_;
        auVar48._8_4_ = auVar140._8_4_ * fVar21;
        fVar24 = local_bc0._12_4_;
        auVar48._12_4_ = auVar140._12_4_ * fVar24;
        fVar27 = local_bc0._16_4_;
        auVar48._16_4_ = auVar140._16_4_ * fVar27;
        fVar30 = local_bc0._20_4_;
        auVar48._20_4_ = auVar140._20_4_ * fVar30;
        fVar33 = local_bc0._24_4_;
        auVar48._24_4_ = auVar140._24_4_ * fVar33;
        auVar48._28_4_ = fVar107;
        auVar81 = vfmsub231ps_fma(auVar48,local_ba0,auVar104);
        auVar41 = vsubps_avx(local_c80,auVar77);
        fVar107 = auVar41._0_4_;
        fVar114 = auVar41._4_4_;
        auVar49._4_4_ = auVar104._4_4_ * fVar114;
        auVar49._0_4_ = auVar104._0_4_ * fVar107;
        fVar22 = auVar41._8_4_;
        auVar49._8_4_ = auVar104._8_4_ * fVar22;
        fVar25 = auVar41._12_4_;
        auVar49._12_4_ = auVar104._12_4_ * fVar25;
        fVar28 = auVar41._16_4_;
        auVar49._16_4_ = auVar104._16_4_ * fVar28;
        fVar31 = auVar41._20_4_;
        auVar49._20_4_ = auVar104._20_4_ * fVar31;
        fVar34 = auVar41._24_4_;
        auVar49._24_4_ = auVar104._24_4_ * fVar34;
        auVar49._28_4_ = auVar104._28_4_;
        auVar135._0_4_ = local_c80._0_4_ + auVar77._0_4_;
        auVar135._4_4_ = local_c80._4_4_ + auVar77._4_4_;
        auVar135._8_4_ = local_c80._8_4_ + auVar77._8_4_;
        auVar135._12_4_ = local_c80._12_4_ + auVar77._12_4_;
        auVar135._16_4_ = local_c80._16_4_ + auVar77._16_4_;
        auVar135._20_4_ = local_c80._20_4_ + auVar77._20_4_;
        auVar135._24_4_ = local_c80._24_4_ + auVar77._24_4_;
        auVar135._28_4_ = local_c80._28_4_ + auVar77._28_4_;
        auVar76 = vfmsub231ps_fma(auVar49,local_bc0,auVar135);
        fVar112 = local_ba0._0_4_;
        fVar115 = local_ba0._4_4_;
        auVar50._4_4_ = auVar135._4_4_ * fVar115;
        auVar50._0_4_ = auVar135._0_4_ * fVar112;
        fVar23 = local_ba0._8_4_;
        auVar50._8_4_ = auVar135._8_4_ * fVar23;
        fVar26 = local_ba0._12_4_;
        auVar50._12_4_ = auVar135._12_4_ * fVar26;
        fVar29 = local_ba0._16_4_;
        auVar50._16_4_ = auVar135._16_4_ * fVar29;
        fVar32 = local_ba0._20_4_;
        auVar50._20_4_ = auVar135._20_4_ * fVar32;
        fVar35 = local_ba0._24_4_;
        auVar50._24_4_ = auVar135._24_4_ * fVar35;
        auVar50._28_4_ = local_bc0._28_4_;
        auVar82 = vfmsub231ps_fma(auVar50,auVar41,auVar140);
        auVar127._0_4_ = auVar82._0_4_ * local_b80;
        auVar127._4_4_ = auVar82._4_4_ * local_b80;
        auVar127._8_4_ = auVar82._8_4_ * local_b80;
        auVar127._12_4_ = auVar82._12_4_ * local_b80;
        auVar127._16_4_ = local_b80 * 0.0;
        auVar127._20_4_ = local_b80 * 0.0;
        auVar127._24_4_ = local_b80 * 0.0;
        auVar127._28_4_ = 0;
        auVar76 = vfmadd231ps_fma(auVar127,auVar138,ZEXT1632(auVar76));
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_b60,ZEXT1632(auVar81));
        auVar42 = vsubps_avx(auVar77,auVar85);
        auVar97._0_4_ = auVar77._0_4_ + auVar85._0_4_;
        auVar97._4_4_ = auVar77._4_4_ + auVar85._4_4_;
        auVar97._8_4_ = auVar77._8_4_ + auVar85._8_4_;
        auVar97._12_4_ = auVar77._12_4_ + auVar85._12_4_;
        auVar97._16_4_ = auVar77._16_4_ + auVar85._16_4_;
        auVar97._20_4_ = auVar77._20_4_ + auVar85._20_4_;
        auVar97._24_4_ = auVar77._24_4_ + auVar85._24_4_;
        auVar97._28_4_ = auVar77._28_4_ + auVar85._28_4_;
        auVar85 = vsubps_avx(auVar78,auVar91);
        auVar110._0_4_ = auVar78._0_4_ + auVar91._0_4_;
        auVar110._4_4_ = auVar78._4_4_ + auVar91._4_4_;
        auVar110._8_4_ = auVar78._8_4_ + auVar91._8_4_;
        auVar110._12_4_ = auVar78._12_4_ + auVar91._12_4_;
        auVar110._16_4_ = auVar78._16_4_ + auVar91._16_4_;
        auVar110._20_4_ = auVar78._20_4_ + auVar91._20_4_;
        auVar110._24_4_ = auVar78._24_4_ + auVar91._24_4_;
        auVar110._28_4_ = auVar78._28_4_ + auVar91._28_4_;
        auVar91 = vsubps_avx(auVar84,auVar40);
        auVar86._0_4_ = auVar84._0_4_ + auVar40._0_4_;
        auVar86._4_4_ = auVar84._4_4_ + auVar40._4_4_;
        auVar86._8_4_ = auVar84._8_4_ + auVar40._8_4_;
        auVar86._12_4_ = auVar84._12_4_ + auVar40._12_4_;
        auVar86._16_4_ = auVar84._16_4_ + auVar40._16_4_;
        auVar86._20_4_ = auVar84._20_4_ + auVar40._20_4_;
        auVar86._24_4_ = auVar84._24_4_ + auVar40._24_4_;
        auVar86._28_4_ = fVar123 + auVar40._28_4_;
        auVar40._4_4_ = auVar91._4_4_ * auVar110._4_4_;
        auVar40._0_4_ = auVar91._0_4_ * auVar110._0_4_;
        auVar40._8_4_ = auVar91._8_4_ * auVar110._8_4_;
        auVar40._12_4_ = auVar91._12_4_ * auVar110._12_4_;
        auVar40._16_4_ = auVar91._16_4_ * auVar110._16_4_;
        auVar40._20_4_ = auVar91._20_4_ * auVar110._20_4_;
        auVar40._24_4_ = auVar91._24_4_ * auVar110._24_4_;
        auVar40._28_4_ = fVar123;
        auVar82 = vfmsub231ps_fma(auVar40,auVar85,auVar86);
        auVar51._4_4_ = auVar86._4_4_ * auVar42._4_4_;
        auVar51._0_4_ = auVar86._0_4_ * auVar42._0_4_;
        auVar51._8_4_ = auVar86._8_4_ * auVar42._8_4_;
        auVar51._12_4_ = auVar86._12_4_ * auVar42._12_4_;
        auVar51._16_4_ = auVar86._16_4_ * auVar42._16_4_;
        auVar51._20_4_ = auVar86._20_4_ * auVar42._20_4_;
        auVar51._24_4_ = auVar86._24_4_ * auVar42._24_4_;
        auVar51._28_4_ = auVar86._28_4_;
        auVar81 = vfmsub231ps_fma(auVar51,auVar91,auVar97);
        auVar52._4_4_ = auVar85._4_4_ * auVar97._4_4_;
        auVar52._0_4_ = auVar85._0_4_ * auVar97._0_4_;
        auVar52._8_4_ = auVar85._8_4_ * auVar97._8_4_;
        auVar52._12_4_ = auVar85._12_4_ * auVar97._12_4_;
        auVar52._16_4_ = auVar85._16_4_ * auVar97._16_4_;
        auVar52._20_4_ = auVar85._20_4_ * auVar97._20_4_;
        auVar52._24_4_ = auVar85._24_4_ * auVar97._24_4_;
        auVar52._28_4_ = auVar97._28_4_;
        auVar83 = vfmsub231ps_fma(auVar52,auVar42,auVar110);
        auVar98._0_4_ = local_b80 * auVar83._0_4_;
        auVar98._4_4_ = local_b80 * auVar83._4_4_;
        auVar98._8_4_ = local_b80 * auVar83._8_4_;
        auVar98._12_4_ = local_b80 * auVar83._12_4_;
        auVar98._16_4_ = local_b80 * 0.0;
        auVar98._20_4_ = local_b80 * 0.0;
        auVar98._24_4_ = local_b80 * 0.0;
        auVar98._28_4_ = 0;
        auVar81 = vfmadd231ps_fma(auVar98,auVar138,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_b60,ZEXT1632(auVar82));
        local_ac0 = ZEXT1632(auVar76);
        local_ae0 = auVar39._0_4_;
        fStack_adc = auVar39._4_4_;
        fStack_ad8 = auVar39._8_4_;
        fStack_ad4 = auVar39._12_4_;
        local_aa0 = ZEXT1632(CONCAT412(auVar81._12_4_ + auVar76._12_4_ + fStack_ad4,
                                       CONCAT48(auVar81._8_4_ + auVar76._8_4_ + fStack_ad8,
                                                CONCAT44(auVar81._4_4_ + auVar76._4_4_ + fStack_adc,
                                                         auVar81._0_4_ + auVar76._0_4_ + local_ae0))
                                      ));
        auVar87._8_4_ = 0x7fffffff;
        auVar87._0_8_ = 0x7fffffff7fffffff;
        auVar87._12_4_ = 0x7fffffff;
        auVar87._16_4_ = 0x7fffffff;
        auVar87._20_4_ = 0x7fffffff;
        auVar87._24_4_ = 0x7fffffff;
        auVar87._28_4_ = 0x7fffffff;
        auVar77 = vminps_avx(ZEXT1632(auVar39),local_ac0);
        auVar77 = vminps_avx(auVar77,ZEXT1632(auVar81));
        local_c00 = vandps_avx(local_aa0,auVar87);
        fVar123 = local_c00._0_4_ * 1.1920929e-07;
        fVar129 = local_c00._4_4_ * 1.1920929e-07;
        auVar53._4_4_ = fVar129;
        auVar53._0_4_ = fVar123;
        fVar130 = local_c00._8_4_ * 1.1920929e-07;
        auVar53._8_4_ = fVar130;
        fVar131 = local_c00._12_4_ * 1.1920929e-07;
        auVar53._12_4_ = fVar131;
        fVar132 = local_c00._16_4_ * 1.1920929e-07;
        auVar53._16_4_ = fVar132;
        fVar133 = local_c00._20_4_ * 1.1920929e-07;
        auVar53._20_4_ = fVar133;
        fVar134 = local_c00._24_4_ * 1.1920929e-07;
        auVar53._24_4_ = fVar134;
        auVar53._28_4_ = 0x34000000;
        auVar118._0_8_ = CONCAT44(fVar129,fVar123) ^ 0x8000000080000000;
        auVar118._8_4_ = -fVar130;
        auVar118._12_4_ = -fVar131;
        auVar118._16_4_ = -fVar132;
        auVar118._20_4_ = -fVar133;
        auVar118._24_4_ = -fVar134;
        auVar118._28_4_ = 0xb4000000;
        auVar77 = vcmpps_avx(auVar77,auVar118,5);
        local_be0 = ZEXT1632(auVar39);
        auVar84 = vmaxps_avx(local_be0,local_ac0);
        auVar78 = vmaxps_avx(auVar84,ZEXT1632(auVar81));
        auVar78 = vcmpps_avx(auVar78,auVar53,2);
        auVar78 = vorps_avx(auVar77,auVar78);
        if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar78 >> 0x7f,0) == '\0') &&
              (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar78 >> 0xbf,0) == '\0') &&
            (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar78[0x1f]) {
LAB_00583b23:
          auVar116 = ZEXT3264(local_cc0);
        }
        else {
          auVar54._4_4_ = fVar115 * auVar96._4_4_;
          auVar54._0_4_ = fVar112 * auVar96._0_4_;
          auVar54._8_4_ = fVar23 * auVar96._8_4_;
          auVar54._12_4_ = fVar26 * auVar96._12_4_;
          auVar54._16_4_ = fVar29 * auVar96._16_4_;
          auVar54._20_4_ = fVar32 * auVar96._20_4_;
          auVar54._24_4_ = fVar35 * auVar96._24_4_;
          auVar54._28_4_ = auVar77._28_4_;
          auVar55._4_4_ = auVar95._4_4_ * fVar114;
          auVar55._0_4_ = auVar95._0_4_ * fVar107;
          auVar55._8_4_ = auVar95._8_4_ * fVar22;
          auVar55._12_4_ = auVar95._12_4_ * fVar25;
          auVar55._16_4_ = auVar95._16_4_ * fVar28;
          auVar55._20_4_ = auVar95._20_4_ * fVar31;
          auVar55._24_4_ = auVar95._24_4_ * fVar34;
          auVar55._28_4_ = 0x34000000;
          auVar39 = vfmsub213ps_fma(auVar95,local_bc0,auVar54);
          auVar56._4_4_ = auVar85._4_4_ * fVar113;
          auVar56._0_4_ = auVar85._0_4_ * fVar111;
          auVar56._8_4_ = auVar85._8_4_ * fVar21;
          auVar56._12_4_ = auVar85._12_4_ * fVar24;
          auVar56._16_4_ = auVar85._16_4_ * fVar27;
          auVar56._20_4_ = auVar85._20_4_ * fVar30;
          auVar56._24_4_ = auVar85._24_4_ * fVar33;
          auVar56._28_4_ = auVar84._28_4_;
          auVar57._4_4_ = auVar91._4_4_ * fVar114;
          auVar57._0_4_ = auVar91._0_4_ * fVar107;
          auVar57._8_4_ = auVar91._8_4_ * fVar22;
          auVar57._12_4_ = auVar91._12_4_ * fVar25;
          auVar57._16_4_ = auVar91._16_4_ * fVar28;
          auVar57._20_4_ = auVar91._20_4_ * fVar31;
          auVar57._24_4_ = auVar91._24_4_ * fVar34;
          auVar57._28_4_ = local_c00._28_4_;
          auVar81 = vfmsub213ps_fma(auVar91,local_ba0,auVar56);
          auVar77 = vandps_avx(auVar54,auVar87);
          auVar84 = vandps_avx(auVar56,auVar87);
          auVar77 = vcmpps_avx(auVar77,auVar84,1);
          local_a80 = vblendvps_avx(ZEXT1632(auVar81),ZEXT1632(auVar39),auVar77);
          auVar58._4_4_ = fVar115 * auVar42._4_4_;
          auVar58._0_4_ = fVar112 * auVar42._0_4_;
          auVar58._8_4_ = fVar23 * auVar42._8_4_;
          auVar58._12_4_ = fVar26 * auVar42._12_4_;
          auVar58._16_4_ = fVar29 * auVar42._16_4_;
          auVar58._20_4_ = fVar32 * auVar42._20_4_;
          auVar58._24_4_ = fVar35 * auVar42._24_4_;
          auVar58._28_4_ = auVar77._28_4_;
          auVar39 = vfmsub213ps_fma(auVar42,local_bc0,auVar57);
          auVar59._4_4_ = auVar79._4_4_ * fVar113;
          auVar59._0_4_ = auVar79._0_4_ * fVar111;
          auVar59._8_4_ = auVar79._8_4_ * fVar21;
          auVar59._12_4_ = auVar79._12_4_ * fVar24;
          auVar59._16_4_ = auVar79._16_4_ * fVar27;
          auVar59._20_4_ = auVar79._20_4_ * fVar30;
          auVar59._24_4_ = auVar79._24_4_ * fVar33;
          auVar59._28_4_ = auVar84._28_4_;
          auVar81 = vfmsub213ps_fma(auVar96,auVar41,auVar59);
          auVar77 = vandps_avx(auVar59,auVar87);
          auVar84 = vandps_avx(auVar57,auVar87);
          auVar77 = vcmpps_avx(auVar77,auVar84,1);
          local_a60 = vblendvps_avx(ZEXT1632(auVar39),ZEXT1632(auVar81),auVar77);
          auVar39 = vfmsub213ps_fma(auVar79,local_ba0,auVar55);
          auVar81 = vfmsub213ps_fma(auVar85,auVar41,auVar58);
          auVar77 = vandps_avx(auVar55,auVar87);
          auVar84 = vandps_avx(auVar58,auVar87);
          auVar77 = vcmpps_avx(auVar77,auVar84,1);
          local_a40 = vblendvps_avx(ZEXT1632(auVar81),ZEXT1632(auVar39),auVar77);
          auVar39 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
          fVar107 = local_a40._0_4_;
          auVar88._0_4_ = fVar107 * local_b80;
          fVar123 = local_a40._4_4_;
          auVar88._4_4_ = fVar123 * local_b80;
          fVar111 = local_a40._8_4_;
          auVar88._8_4_ = fVar111 * local_b80;
          fVar112 = local_a40._12_4_;
          auVar88._12_4_ = fVar112 * local_b80;
          fVar113 = local_a40._16_4_;
          auVar88._16_4_ = fVar113 * local_b80;
          fVar114 = local_a40._20_4_;
          auVar88._20_4_ = fVar114 * local_b80;
          fVar115 = local_a40._24_4_;
          auVar88._24_4_ = fVar115 * local_b80;
          auVar88._28_4_ = 0;
          auVar81 = vfmadd213ps_fma(auVar138,local_a60,auVar88);
          auVar81 = vfmadd213ps_fma(local_b60,local_a80,ZEXT1632(auVar81));
          auVar84 = ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                       CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                CONCAT44(auVar81._4_4_ + auVar81._4_4_,
                                                         auVar81._0_4_ + auVar81._0_4_))));
          auVar60._4_4_ = fVar123 * fVar15;
          auVar60._0_4_ = fVar107 * fVar14;
          auVar60._8_4_ = fVar111 * fVar16;
          auVar60._12_4_ = fVar112 * fVar17;
          auVar60._16_4_ = fVar113 * fVar18;
          auVar60._20_4_ = fVar114 * fVar19;
          auVar60._24_4_ = fVar115 * fVar20;
          auVar60._28_4_ = auVar78._28_4_;
          auVar81 = vfmadd213ps_fma(auVar121,local_a60,auVar60);
          auVar82 = vfmadd213ps_fma(local_c80,local_a80,ZEXT1632(auVar81));
          auVar77 = vrcpps_avx(auVar84);
          auVar136._8_4_ = 0x3f800000;
          auVar136._0_8_ = 0x3f8000003f800000;
          auVar136._12_4_ = 0x3f800000;
          auVar136._16_4_ = 0x3f800000;
          auVar136._20_4_ = 0x3f800000;
          auVar136._24_4_ = 0x3f800000;
          auVar136._28_4_ = 0x3f800000;
          auVar81 = vfnmadd213ps_fma(auVar77,auVar84,auVar136);
          auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar77,auVar77);
          local_9c0 = ZEXT1632(CONCAT412(auVar81._12_4_ * (auVar82._12_4_ + auVar82._12_4_),
                                         CONCAT48(auVar81._8_4_ * (auVar82._8_4_ + auVar82._8_4_),
                                                  CONCAT44(auVar81._4_4_ *
                                                           (auVar82._4_4_ + auVar82._4_4_),
                                                           auVar81._0_4_ *
                                                           (auVar82._0_4_ + auVar82._0_4_)))));
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar121._4_4_ = uVar2;
          auVar121._0_4_ = uVar2;
          auVar121._8_4_ = uVar2;
          auVar121._12_4_ = uVar2;
          auVar121._16_4_ = uVar2;
          auVar121._20_4_ = uVar2;
          auVar121._24_4_ = uVar2;
          auVar121._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_c60._4_4_ = uVar2;
          local_c60._0_4_ = uVar2;
          local_c60._8_4_ = uVar2;
          local_c60._12_4_ = uVar2;
          local_c60._16_4_ = uVar2;
          local_c60._20_4_ = uVar2;
          local_c60._24_4_ = uVar2;
          local_c60._28_4_ = uVar2;
          auVar77 = vcmpps_avx(auVar121,local_9c0,2);
          auVar78 = vcmpps_avx(local_9c0,local_c60,2);
          auVar77 = vandps_avx(auVar77,auVar78);
          auVar81 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
          auVar39 = vpand_avx(auVar81,auVar39);
          auVar77 = vpmovsxwd_avx2(auVar39);
          if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar77 >> 0x7f,0) == '\0') &&
                (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar77 >> 0xbf,0) == '\0') &&
              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar77[0x1f]) goto LAB_00583b23;
          auVar77 = vcmpps_avx(auVar84,_DAT_01faff00,4);
          auVar81 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
          auVar39 = vpand_avx(auVar39,auVar81);
          local_a20 = vpmovsxwd_avx2(auVar39);
          if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_a20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_a20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_a20 >> 0x7f,0) == '\0') &&
                (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_a20 >> 0xbf,0) == '\0') &&
              (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_a20[0x1f]) goto LAB_00583b23;
          uStack_ad0 = 0;
          uStack_acc = 0;
          uStack_ac8 = 0;
          uStack_ac4 = 0;
          local_940 = local_b40;
          auVar77 = vrcpps_avx(local_aa0);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar105._16_4_ = 0x3f800000;
          auVar105._20_4_ = 0x3f800000;
          auVar105._24_4_ = 0x3f800000;
          auVar105._28_4_ = 0x3f800000;
          auVar81 = vfnmadd213ps_fma(local_aa0,auVar77,auVar105);
          auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar77,auVar77);
          auVar99._8_4_ = 0x219392ef;
          auVar99._0_8_ = 0x219392ef219392ef;
          auVar99._12_4_ = 0x219392ef;
          auVar99._16_4_ = 0x219392ef;
          auVar99._20_4_ = 0x219392ef;
          auVar99._24_4_ = 0x219392ef;
          auVar99._28_4_ = 0x219392ef;
          auVar77 = vcmpps_avx(local_c00,auVar99,5);
          auVar77 = vandps_avx(auVar77,ZEXT1632(auVar81));
          auVar61._4_4_ = fStack_adc * auVar77._4_4_;
          auVar61._0_4_ = local_ae0 * auVar77._0_4_;
          auVar61._8_4_ = fStack_ad8 * auVar77._8_4_;
          auVar61._12_4_ = fStack_ad4 * auVar77._12_4_;
          auVar61._16_4_ = auVar77._16_4_ * 0.0;
          auVar61._20_4_ = auVar77._20_4_ * 0.0;
          auVar61._24_4_ = auVar77._24_4_ * 0.0;
          auVar61._28_4_ = 0;
          auVar78 = vminps_avx(auVar61,auVar105);
          auVar62._4_4_ = auVar76._4_4_ * auVar77._4_4_;
          auVar62._0_4_ = auVar76._0_4_ * auVar77._0_4_;
          auVar62._8_4_ = auVar76._8_4_ * auVar77._8_4_;
          auVar62._12_4_ = auVar76._12_4_ * auVar77._12_4_;
          auVar62._16_4_ = auVar77._16_4_ * 0.0;
          auVar62._20_4_ = auVar77._20_4_ * 0.0;
          auVar62._24_4_ = auVar77._24_4_ * 0.0;
          auVar62._28_4_ = auVar41._28_4_;
          auVar77 = vminps_avx(auVar62,auVar105);
          auVar84 = vsubps_avx(auVar105,auVar78);
          auVar121 = vsubps_avx(auVar105,auVar77);
          local_9e0 = vblendvps_avx(auVar77,auVar84,local_b40);
          local_a00 = vblendvps_avx(auVar78,auVar121,local_b40);
          auVar116 = ZEXT3264(local_cc0);
          fVar14 = local_cc0._0_4_;
          fVar15 = local_cc0._4_4_;
          fVar16 = local_cc0._8_4_;
          fVar17 = local_cc0._12_4_;
          fVar18 = local_cc0._16_4_;
          fVar19 = local_cc0._20_4_;
          fVar20 = local_cc0._24_4_;
          local_980._4_4_ = fVar15 * local_a60._4_4_;
          local_980._0_4_ = fVar14 * local_a60._0_4_;
          local_980._8_4_ = fVar16 * local_a60._8_4_;
          local_980._12_4_ = fVar17 * local_a60._12_4_;
          local_980._16_4_ = fVar18 * local_a60._16_4_;
          local_980._20_4_ = fVar19 * local_a60._20_4_;
          local_980._24_4_ = fVar20 * local_a60._24_4_;
          local_980._28_4_ = local_9e0._28_4_;
          local_9a0[0] = local_a80._0_4_ * fVar14;
          local_9a0[1] = local_a80._4_4_ * fVar15;
          local_9a0[2] = local_a80._8_4_ * fVar16;
          local_9a0[3] = local_a80._12_4_ * fVar17;
          fStack_990 = local_a80._16_4_ * fVar18;
          fStack_98c = local_a80._20_4_ * fVar19;
          fStack_988 = local_a80._24_4_ * fVar20;
          uStack_984 = local_a00._28_4_;
          local_960[0] = fVar14 * fVar107;
          local_960[1] = fVar15 * fVar123;
          local_960[2] = fVar16 * fVar111;
          local_960[3] = fVar17 * fVar112;
          fStack_950 = fVar18 * fVar113;
          fStack_94c = fVar19 * fVar114;
          fStack_948 = fVar20 * fVar115;
          uStack_944 = auVar84._28_4_;
          auVar39 = vpacksswb_avx(auVar39,auVar39);
          uVar68 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar39 >> 0x3f,0) << 7);
          fStack_b7c = local_b80;
          fStack_b78 = local_b80;
          fStack_b74 = local_b80;
          fStack_b70 = local_b80;
          fStack_b6c = local_b80;
          fStack_b68 = local_b80;
          fStack_b64 = local_b80;
          do {
            uVar44 = 0;
            for (uVar45 = uVar68; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              uVar44 = uVar44 + 1;
            }
            uVar66 = *(uint *)((long)&local_b00 + uVar44 * 4);
            pGVar12 = (pSVar6->geometries).items[uVar66].ptr;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar68 = uVar68 ^ 1L << (uVar44 & 0x3f);
            }
            else {
              local_c80._0_8_ = uVar44;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00583bb2:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar75;
              }
              local_ca0._0_8_ = uVar68;
              uVar68 = (ulong)(uint)((int)uVar44 * 4);
              local_8c0 = *(undefined4 *)(local_a00 + uVar68);
              local_8a0 = *(undefined4 *)(local_9e0 + uVar68);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar68);
              local_cf0.context = context->user;
              local_880 = *(undefined4 *)((long)&local_b20 + uVar68);
              local_920 = *(undefined4 *)((long)local_9a0 + uVar68);
              uVar2 = *(undefined4 *)(local_980 + uVar68);
              local_900._4_4_ = uVar2;
              local_900._0_4_ = uVar2;
              local_900._8_4_ = uVar2;
              local_900._12_4_ = uVar2;
              local_900._16_4_ = uVar2;
              local_900._20_4_ = uVar2;
              local_900._24_4_ = uVar2;
              local_900._28_4_ = uVar2;
              local_8e0 = *(undefined4 *)((long)local_960 + uVar68);
              local_860._4_4_ = uVar66;
              local_860._0_4_ = uVar66;
              local_860._8_4_ = uVar66;
              local_860._12_4_ = uVar66;
              local_860._16_4_ = uVar66;
              local_860._20_4_ = uVar66;
              local_860._24_4_ = uVar66;
              local_860._28_4_ = uVar66;
              uStack_91c = local_920;
              uStack_918 = local_920;
              uStack_914 = local_920;
              uStack_910 = local_920;
              uStack_90c = local_920;
              uStack_908 = local_920;
              uStack_904 = local_920;
              uStack_8dc = local_8e0;
              uStack_8d8 = local_8e0;
              uStack_8d4 = local_8e0;
              uStack_8d0 = local_8e0;
              uStack_8cc = local_8e0;
              uStack_8c8 = local_8e0;
              uStack_8c4 = local_8e0;
              uStack_8bc = local_8c0;
              uStack_8b8 = local_8c0;
              uStack_8b4 = local_8c0;
              uStack_8b0 = local_8c0;
              uStack_8ac = local_8c0;
              uStack_8a8 = local_8c0;
              uStack_8a4 = local_8c0;
              uStack_89c = local_8a0;
              uStack_898 = local_8a0;
              uStack_894 = local_8a0;
              uStack_890 = local_8a0;
              uStack_88c = local_8a0;
              uStack_888 = local_8a0;
              uStack_884 = local_8a0;
              uStack_87c = local_880;
              uStack_878 = local_880;
              uStack_874 = local_880;
              uStack_870 = local_880;
              uStack_86c = local_880;
              uStack_868 = local_880;
              uStack_864 = local_880;
              auVar77 = vpcmpeqd_avx2(local_860,local_860);
              uStack_83c = (local_cf0.context)->instID[0];
              local_840 = uStack_83c;
              uStack_838 = uStack_83c;
              uStack_834 = uStack_83c;
              uStack_830 = uStack_83c;
              uStack_82c = uStack_83c;
              uStack_828 = uStack_83c;
              uStack_824 = uStack_83c;
              uStack_81c = (local_cf0.context)->instPrimID[0];
              local_820 = uStack_81c;
              uStack_818 = uStack_81c;
              uStack_814 = uStack_81c;
              uStack_810 = uStack_81c;
              uStack_80c = uStack_81c;
              uStack_808 = uStack_81c;
              uStack_804 = uStack_81c;
              local_c40 = local_c20;
              local_cf0.valid = (int *)local_c40;
              local_cf0.geometryUserPtr = pGVar12->userPtr;
              local_cf0.hit = (RTCHitN *)&local_920;
              local_cf0.N = 8;
              local_cf0.ray = (RTCRayN *)ray;
              if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar77 = ZEXT1632(auVar77._0_16_);
                (*pGVar12->occlusionFilterN)(&local_cf0);
                auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
              }
              auVar84 = vpcmpeqd_avx2(local_c40,_DAT_01faff00);
              auVar78 = auVar77 & ~auVar84;
              if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar78 >> 0x7f,0) == '\0') &&
                    (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar78 >> 0xbf,0) == '\0') &&
                  (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar78[0x1f]) {
                auVar84 = auVar84 ^ auVar77;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar77 = ZEXT1632(auVar77._0_16_);
                  (*p_Var13)(&local_cf0);
                  auVar77 = vpcmpeqd_avx2(auVar77,auVar77);
                }
                auVar78 = vpcmpeqd_avx2(local_c40,_DAT_01faff00);
                auVar84 = auVar78 ^ auVar77;
                auVar93._8_4_ = 0xff800000;
                auVar93._0_8_ = 0xff800000ff800000;
                auVar93._12_4_ = 0xff800000;
                auVar93._16_4_ = 0xff800000;
                auVar93._20_4_ = 0xff800000;
                auVar93._24_4_ = 0xff800000;
                auVar93._28_4_ = 0xff800000;
                auVar77 = vblendvps_avx(auVar93,*(undefined1 (*) [32])(local_cf0.ray + 0x100),
                                        auVar78);
                *(undefined1 (*) [32])(local_cf0.ray + 0x100) = auVar77;
              }
              auVar116 = ZEXT3264(local_cc0);
              if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar84 >> 0x7f,0) != '\0') ||
                    (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar84 >> 0xbf,0) != '\0') ||
                  (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar84[0x1f] < '\0') goto LAB_00583bb2;
              *(int *)(ray + k * 4 + 0x100) = local_c60._0_4_;
              uVar68 = local_ca0._0_8_ ^ 1L << (local_c80._0_8_ & 0x3f);
            }
          } while (uVar68 != 0);
        }
        auVar128 = ZEXT1664(auVar124);
        auVar122 = ZEXT1664(auVar120);
        auVar119 = ZEXT1664(auVar117);
        auVar106 = ZEXT1664(auVar101);
        auVar100 = ZEXT1664(auVar94);
        lVar67 = lVar67 + 1;
      } while (lVar67 != uVar64 - 8);
    }
LAB_00583b9c:
    bVar75 = puVar70 != &local_800;
    if (!bVar75) {
      return bVar75;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }